

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

int get_request(curl_socket_t sock,httprequest *req)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  unsigned_short uVar4;
  int iVar5;
  int iVar6;
  ssize_t sVar7;
  char *pcVar8;
  uint *puVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  long *plVar14;
  int *piVar15;
  char *pcVar16;
  ulong uVar17;
  char *pcVar18;
  byte *pbVar19;
  size_t sVar20;
  uint uVar21;
  int prot_minor;
  int prot_major;
  char *local_208;
  char *endp;
  char logbuf [456];
  
  uVar12 = req->offset;
  pcVar18 = "Request would overflow buffer, closing connection";
  if (0x249ee < uVar12) goto LAB_0010768d;
  if (req->skip == 0) {
    sVar10 = 149999 - uVar12;
  }
  else {
    sVar10 = req->cl;
  }
  sVar7 = recv(sock,req->reqbuf + uVar12,sVar10,0);
  if (got_exit_signal != 0) {
    return -1;
  }
  if (sVar7 == 0) {
    logmsg("Connection closed by client");
LAB_00106d90:
    req->reqbuf[req->offset] = '\0';
    storerequest(req->reqbuf,req->offset);
    return -1;
  }
  if (sVar7 < 0) {
    puVar9 = (uint *)__errno_location();
    uVar21 = *puVar9;
    if (uVar21 == 0xb) {
      return 0;
    }
    pcVar18 = strerror(uVar21);
    logmsg("recv() returned error: (%d) %s",(ulong)uVar21,pcVar18);
    goto LAB_00106d90;
  }
  logmsg("Read %zd bytes",sVar7);
  sVar20 = sVar7 + req->offset;
  req->offset = sVar20;
  req->reqbuf[sVar20] = '\0';
  pcVar18 = req->reqbuf + req->checkindex;
  pcVar8 = strstr(pcVar18,end_of_headers);
  iVar5 = req->callcount;
  req->callcount = iVar5 + 1;
  pcVar16 = "";
  if (0 < iVar5) {
    pcVar16 = " [CONTINUED]";
  }
  logmsg("Process %d bytes request%s",req->offset,pcVar16);
  uVar21 = 1;
  if (use_gopher == '\x01') {
    if (req->testno != -4) goto LAB_00106e7d;
    iVar5 = strncmp("/verifiedserver",pcVar18,0xf);
    if (iVar5 != 0) goto LAB_00106dbc;
    logmsg("Are-we-friendly question received");
    req->testno = -2;
  }
  else {
    if (req->testno == -4) {
LAB_00106dbc:
      iVar6 = __isoc99_sscanf(pcVar18,"%255s %139999s HTTP/%d.%d",ProcessRequest_request,
                              &ProcessRequest_doc,&prot_major,&prot_minor);
      iVar2 = prot_major;
      iVar5 = prot_minor;
      if (iVar6 != 4) goto LAB_00106e7d;
      req->prot_version = prot_major * 10 + prot_minor;
      pcVar16 = strrchr(&ProcessRequest_doc,0x2f);
      local_208 = pcVar16;
      if (pcVar16 != (char *)0x0) {
        sVar10 = strlen(&ProcessRequest_doc);
        sVar11 = strlen(ProcessRequest_request);
        if (sVar11 + sVar10 < 400) {
          curl_msnprintf(logbuf,0x1c8,"Got request: %s %s HTTP/%d.%d",ProcessRequest_request,
                         &ProcessRequest_doc,(ulong)(uint)iVar2,iVar5);
        }
        else {
          curl_msnprintf(logbuf,0x1c8,"Got a *HUGE* request HTTP/%d.%d",(ulong)(uint)iVar2);
        }
        logmsg("%s",logbuf);
        iVar5 = strncmp("/verifiedserver",pcVar16,0xf);
        uVar21 = 1;
        if (iVar5 == 0) {
          lVar13 = -2;
          pcVar18 = "Are-we-friendly question received";
        }
        else {
          iVar5 = strncmp("/quit",pcVar16,5);
          if (iVar5 != 0) {
            do {
              pcVar16 = pcVar16 + 1;
              if (*pcVar16 == 0) break;
              iVar5 = Curl_isdigit((uint)(byte)*pcVar16);
            } while (iVar5 == 0);
            local_208 = pcVar16;
            uVar12 = strtol(pcVar16,&local_208,10);
            req->testno = uVar12;
            if (10000 < (long)uVar12) {
              req->partno = uVar12 % 10000;
              req->testno = uVar12 / 10000;
              uVar12 = uVar12 / 10000;
LAB_00106fcc:
              curl_msnprintf(logbuf,0x1c8,"Requested test number %ld part %ld",uVar12);
              logmsg("%s",logbuf);
              goto LAB_00106ffb;
            }
            req->partno = 0;
            if (uVar12 != 0) goto LAB_00106fcc;
            logmsg("No test number");
            req->testno = -4;
            goto LAB_00107015;
          }
          lVar13 = -3;
          pcVar18 = "Request-to-quit received";
        }
        logmsg(pcVar18);
        req->testno = lVar13;
        goto LAB_00107663;
      }
LAB_00106ffb:
      if (req->testno == -4) {
LAB_00107015:
        iVar5 = __isoc99_sscanf(req,"CONNECT %139999s HTTP/%d.%d",&ProcessRequest_doc,&prot_major);
        if (iVar5 == 3) {
          curl_msnprintf(logbuf,0x1c8,"Received a CONNECT %s HTTP/%d.%d request",&ProcessRequest_doc
                         ,(ulong)(uint)prot_major,(ulong)(uint)prot_minor);
          logmsg("%s");
          req->connect_request = true;
          if (req->prot_version == 10) {
            req->open = false;
          }
          if (ProcessRequest_doc == '[') {
            uVar12 = 0;
            pcVar16 = "Invalid CONNECT IPv6 address format";
            pbVar3 = &DAT_0010f791;
            while (pbVar19 = pbVar3, *pbVar19 != 0) {
              iVar5 = Curl_isxdigit((uint)*pbVar19);
              if (((iVar5 == 0) && (bVar1 = *pbVar19, bVar1 != 0x2e)) && (bVar1 != 0x3a)) {
                if (bVar1 == 0x5d) {
                  if (pbVar19[1] == 0x3a) {
                    pbVar19 = pbVar19 + 1;
                    goto LAB_00107161;
                  }
                  pcVar16 = "Invalid CONNECT IPv6 port format";
                }
                break;
              }
              uVar12 = strtoul((char *)pbVar19,&endp,0x10);
              iVar5 = Curl_isxdigit((uint)*pbVar19);
              pbVar3 = (byte *)endp;
              if (iVar5 == 0) {
                pbVar3 = pbVar19 + 1;
              }
            }
            pbVar19 = (byte *)0x0;
            logmsg(pcVar16);
LAB_00107161:
            req->testno = uVar12;
          }
          else {
            pbVar19 = (byte *)strchr(&ProcessRequest_doc,0x3a);
          }
          if (((pbVar19 != (byte *)0x0) && (pbVar19[1] != 0)) &&
             (iVar5 = Curl_isdigit((uint)pbVar19[1]), iVar5 != 0)) {
            uVar12 = strtoul((char *)(pbVar19 + 1),(char **)0x0,10);
            if (uVar12 - 0x10000 < 0xffffffffffff0001) {
              logmsg("Invalid CONNECT port received");
            }
            else {
              uVar4 = curlx_ultous(uVar12);
              req->connect_port = uVar4;
            }
          }
          logmsg("Port number: %d, test case number: %ld",(ulong)req->connect_port,req->testno);
        }
        if (req->testno == -4) {
          pcVar16 = strrchr(&ProcessRequest_doc,0x2e);
          if (pcVar16 != (char *)0x0) {
            local_208 = pcVar16 + 1;
            uVar12 = strtol(local_208,&local_208,10);
            req->testno = uVar12;
            if ((long)uVar12 < 0x2711) {
              req->partno = 0;
            }
            else {
              req->partno = uVar12 % 10000;
              req->testno = uVar12 / 10000;
              logmsg("found test %d in requested host name",uVar12 / 10000);
              uVar12 = req->testno;
            }
            curl_msnprintf(logbuf,0x1c8,"Requested test number %ld part %ld (from host name)",uVar12
                          );
            logmsg("%s",logbuf);
            if (req->testno == 0) {
              logmsg("Did not find test number in PATH");
              req->testno = -1;
              goto LAB_001072ce;
            }
          }
          parse_servercmd(req);
        }
      }
    }
    else {
LAB_00106e7d:
      if ((2 < req->offset) && (req->testno == -4)) {
        logmsg("** Unusual request. Starts with %02x %02x %02x (%c%c%c)");
      }
    }
LAB_001072ce:
    if (pcVar8 == (char *)0x0) {
      uVar21 = 0;
      logmsg("request not complete yet");
    }
    else {
      logmsg("- request found to be complete (%d)",req->testno);
      if (req->testno == -4) {
        pcVar16 = strstr(pcVar18,"\nTestno: ");
        if (pcVar16 == (char *)0x0) {
          logmsg("No Testno: header");
        }
        else {
          lVar13 = strtol(pcVar16 + 9,(char **)0x0,10);
          req->testno = lVar13;
          logmsg("Found test number %d in Testno: header!",lVar13);
        }
      }
      parse_servercmd(req);
      if ((use_gopher == '\x01') && (pcVar16 = strrchr(pcVar18,0x2f), pcVar16 != (char *)0x0)) {
        do {
          pcVar16 = pcVar16 + 1;
          if (*pcVar16 == 0) break;
          iVar5 = Curl_isdigit((uint)(byte)*pcVar16);
        } while (iVar5 == 0);
        local_208 = pcVar16;
        uVar12 = strtol(pcVar16,&local_208,10);
        if ((long)uVar12 < 0x2711) {
          uVar17 = 0;
        }
        else {
          uVar17 = uVar12 % 10000;
          uVar12 = uVar12 / 10000;
        }
        req->testno = uVar12;
        req->partno = uVar17;
        curl_msnprintf(logbuf,0x1c8,"Requested GOPHER test number %ld part %ld",uVar12);
        logmsg("%s",logbuf);
      }
LAB_0010741f:
      if (got_exit_signal != 0) goto LAB_00107655;
      if ((req->cl != 0) ||
         (iVar5 = Curl_strncasecompare("Content-Length:",pcVar18,0xf), iVar5 == 0)) {
        iVar5 = Curl_strncasecompare("Transfer-Encoding: chunked",pcVar18,0x1a);
        if (iVar5 == 0) goto code_r0x00107466;
        pcVar18 = strstr(req->reqbuf,"\r\n0\r\n\r\n");
        if (pcVar18 != (char *)0x0) goto LAB_00107655;
        pcVar18 = strstr(req->reqbuf,"\r\n0\r\n");
        if (pcVar18 == (char *)0x0) {
          uVar21 = 1;
          if ((already_recv_zeroed_chunk != '\x01') ||
             (pcVar18 = strstr(req->reqbuf,"\r\n\r\n"), pcVar18 == (char *)0x0)) goto LAB_0010777d;
        }
        else {
          pcVar8 = strstr(req->reqbuf,"\r\n\r\n");
          do {
            pcVar16 = pcVar8;
            pcVar8 = strstr(pcVar16 + 4,"\r\n\r\n");
          } while (pcVar8 != (char *)0x0);
          uVar21 = 1;
          if (pcVar18 < pcVar16) goto LAB_00107663;
          already_recv_zeroed_chunk = '\x01';
LAB_0010777d:
          uVar21 = 0;
        }
        goto LAB_00107663;
      }
      pcVar18 = pcVar18 + 0xf;
      while ((*pcVar18 != 0 && (iVar5 = Curl_isspace((uint)(byte)*pcVar18), iVar5 != 0))) {
        pcVar18 = pcVar18 + 1;
      }
      local_208 = pcVar18;
      piVar15 = __errno_location();
      *piVar15 = 0;
      uVar12 = strtoul(pcVar18,&local_208,10);
      if (((pcVar18 != local_208) && (iVar5 = Curl_isspace((uint)(byte)*local_208), iVar5 != 0)) &&
         (*piVar15 != 0x22)) {
        req->cl = uVar12 - (long)req->skip;
        logmsg("Found Content-Length: %lu in the request",uVar12);
        if (req->skip != 0) {
          logmsg("... but will abort after %zu bytes",req->cl);
        }
LAB_0010747a:
        if (((req->auth == false) &&
            (pcVar18 = strstr(req->reqbuf,"Authorization:"), pcVar18 != (char *)0x0)) &&
           (req->auth = true, req->auth_req == true)) {
          logmsg("Authorization header found, as required");
        }
        pcVar18 = strstr(req->reqbuf,"Authorization: Negotiate");
        if (pcVar18 == (char *)0x0) {
          if ((req->digest == false) &&
             (pcVar18 = strstr(req->reqbuf,"Authorization: Digest"), pcVar18 != (char *)0x0)) {
            sVar20 = req->partno + 1000;
            req->partno = sVar20;
            req->digest = true;
            pcVar18 = "Received Digest request, sending back data %ld";
          }
          else if (req->ntlm == false) {
            pcVar18 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAD");
            if (pcVar18 == (char *)0x0) {
              pcVar18 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAB");
              if (pcVar18 == (char *)0x0) goto LAB_00107710;
              sVar20 = req->partno + 0x3e9;
              req->partno = sVar20;
              req->ntlm = true;
              pcVar18 = "Received NTLM type-1, sending back data %ld";
            }
            else {
              req->partno = req->partno + 0x3ea;
              req->ntlm = true;
              logmsg("Received NTLM type-3, sending back data %ld");
              sVar20 = req->cl;
              if (sVar20 == 0) goto LAB_0010786d;
              pcVar18 = "  Expecting %zu POSTed bytes";
            }
          }
          else {
LAB_00107710:
            lVar13 = req->partno;
            if ((lVar13 < 1000) ||
               (pcVar18 = strstr(req->reqbuf,"Authorization: Basic"), pcVar18 == (char *)0x0))
            goto LAB_0010786d;
            sVar20 = lVar13 + 1;
            req->partno = sVar20;
            pcVar18 = "Received Basic request, sending back data %ld";
          }
          logmsg(pcVar18,sVar20);
        }
        else {
          logmsg("Negotiate: prev_testno: %d, prev_partno: %d",ProcessRequest_prev_testno,
                 ProcessRequest_prev_partno);
          if (req->testno == ProcessRequest_prev_testno) {
            plVar14 = &ProcessRequest_prev_partno;
          }
          else {
            plVar14 = &req->partno;
            ProcessRequest_prev_testno = req->testno;
          }
          ProcessRequest_prev_partno = *plVar14 + 1;
          req->partno = ProcessRequest_prev_partno;
        }
LAB_0010786d:
        pcVar18 = strstr(req->reqbuf,"Connection: close");
        if (pcVar18 == (char *)0x0) {
          if ((((((req->open & 1U) != 0) && (10 < req->prot_version)) &&
               (sVar20 = req->offset, sVar10 = strlen(end_of_headers),
               pcVar8 + sVar10 < req->reqbuf + sVar20)) && (req->cl == 0)) &&
             ((((req->reqbuf[0] == 'G' && (req->reqbuf[1] == 'E')) && (req->reqbuf[2] == 'T')) ||
              (iVar5 = strncmp(req->reqbuf,"HEAD",4), iVar5 == 0)))) {
            req->checkindex = (size_t)(pcVar8 + (sVar10 - (long)req));
          }
        }
        else {
          req->open = false;
        }
        uVar21 = 1;
        if ((req->auth_req == true) && (req->auth == false)) {
          logmsg("Return early due to auth requested by none provided");
        }
        else {
          if ((req->upgrade == true) &&
             (pcVar18 = strstr(req->reqbuf,"Upgrade:"), pcVar18 != (char *)0x0)) {
            logmsg("Found Upgrade: in request and allows it");
            req->upgrade_request = true;
          }
          uVar12 = req->cl;
          if (uVar12 != 0) {
            sVar20 = req->offset;
            sVar10 = strlen(end_of_headers);
            uVar21 = (uint)(uVar12 <= (long)req + (sVar20 - (long)(pcVar8 + sVar10)));
          }
        }
        goto LAB_00107663;
      }
      logmsg("Found invalid Content-Length: (%s) in the request",pcVar18);
      req->open = false;
LAB_00107655:
      uVar21 = 1;
    }
  }
LAB_00107663:
  pcVar18 = "Request would overflow buffer, closing connection";
  req->done_processing = uVar21;
  if (got_exit_signal != 0) {
    return -1;
  }
  uVar12 = req->offset;
  if (uVar12 == 149999) {
LAB_0010768d:
    uVar21 = 0xffffffff;
    logmsg(pcVar18);
    req->reqbuf[149999] = '\0';
  }
  else {
    if (149999 < uVar12) {
      pcVar18 = "Request buffer overflow, closing connection";
      goto LAB_0010768d;
    }
    req->reqbuf[uVar12] = '\0';
    uVar21 = 1;
    if (req->done_processing == 0) goto LAB_001076b0;
  }
  storerequest(req->reqbuf,req->offset);
LAB_001076b0:
  return -(uint)(got_exit_signal != 0) | uVar21;
code_r0x00107466:
  pcVar16 = strchr(pcVar18,10);
  pcVar18 = pcVar16 + 1;
  if (pcVar16 == (char *)0x0) goto LAB_0010747a;
  goto LAB_0010741f;
}

Assistant:

static int get_request(curl_socket_t sock, struct httprequest *req)
{
  int fail = 0;
  char *reqbuf = req->reqbuf;
  ssize_t got = 0;
  int overflow = 0;

  if(req->offset >= REQBUFSIZ-1) {
    /* buffer is already full; do nothing */
    overflow = 1;
  }
  else {
    if(req->skip)
      /* we are instructed to not read the entire thing, so we make sure to
         only read what we're supposed to and NOT read the enire thing the
         client wants to send! */
      got = sread(sock, reqbuf + req->offset, req->cl);
    else
      got = sread(sock, reqbuf + req->offset, REQBUFSIZ-1 - req->offset);

    if(got_exit_signal)
      return -1;
    if(got == 0) {
      logmsg("Connection closed by client");
      fail = 1;
    }
    else if(got < 0) {
      int error = SOCKERRNO;
      if(EAGAIN == error || EWOULDBLOCK == error) {
        /* nothing to read at the moment */
        return 0;
      }
      logmsg("recv() returned error: (%d) %s", error, strerror(error));
      fail = 1;
    }
    if(fail) {
      /* dump the request received so far to the external file */
      reqbuf[req->offset] = '\0';
      storerequest(reqbuf, req->offset);
      return -1;
    }

    logmsg("Read %zd bytes", got);

    req->offset += (size_t)got;
    reqbuf[req->offset] = '\0';

    req->done_processing = ProcessRequest(req);
    if(got_exit_signal)
      return -1;
  }

  if(overflow || (req->offset == REQBUFSIZ-1 && got > 0)) {
    logmsg("Request would overflow buffer, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else if(req->offset > REQBUFSIZ-1) {
    logmsg("Request buffer overflow, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else
    reqbuf[req->offset] = '\0';

  /* at the end of a request dump it to an external file */
  if(fail || req->done_processing)
    storerequest(reqbuf, req->offset);
  if(got_exit_signal)
    return -1;

  return fail ? -1 : 1;
}